

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_expression_iterator.cpp
# Opt level: O0

void duckdb::ParsedExpressionIterator::EnumerateChildren
               (ParsedExpression *expr,
               function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
               *callback)

{
  ExpressionClass EVar1;
  bool bVar2;
  pointer pOVar3;
  NotImplementedException *this;
  BaseExpression *in_RDI;
  OrderByNode *order_2;
  iterator __end3_8;
  iterator __begin3_8;
  vector<duckdb::OrderByNode,_true> *__range3_8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child_3
  ;
  iterator __end3_7;
  iterator __begin3_7;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range3_7;
  OrderByNode *order_1;
  iterator __end3_6;
  iterator __begin3_6;
  vector<duckdb::OrderByNode,_true> *__range3_6;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *partition;
  iterator __end3_5;
  iterator __begin3_5;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range3_5;
  WindowExpression *window_expr;
  SubqueryExpression *subquery_expr;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>
  *item;
  iterator __end3_4;
  iterator __begin3_4;
  case_insensitive_map_t<unique_ptr<ParsedExpression>_> *__range3_4;
  StarExpression *star_expr;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child_2
  ;
  iterator __end3_3;
  iterator __begin3_3;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range3_3;
  OperatorExpression *op_expr;
  LambdaExpression *lambda_expr;
  OrderByNode *order;
  iterator __end4;
  iterator __begin4;
  vector<duckdb::OrderByNode,_true> *__range4;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child_1
  ;
  iterator __end3_2;
  iterator __begin3_2;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range3_2;
  FunctionExpression *func_expr;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  iterator __end3_1;
  iterator __begin3_1;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range3_1;
  ConjunctionExpression *conj_expr;
  ComparisonExpression *comp_expr;
  CollateExpression *cast_expr_2;
  CastExpression *cast_expr_1;
  CaseCheck *check;
  iterator __end3;
  iterator __begin3;
  vector<duckdb::CaseCheck,_true> *__range3;
  CaseExpression *case_expr;
  BetweenExpression *cast_expr;
  string *in_stack_fffffffffffffdf8;
  function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
  *in_stack_fffffffffffffe00;
  allocator aStack_1d1;
  string asStack_1d0 [16];
  BaseExpression *in_stack_fffffffffffffe40;
  __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
  _Stack_1a0;
  vector<duckdb::OrderByNode,_true> *pvStack_198;
  reference puStack_190;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *puStack_188;
  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
  _Stack_180;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *pvStack_178;
  reference pOStack_170;
  OrderByNode *pOStack_168;
  __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
  _Stack_160;
  vector<duckdb::OrderByNode,_true> *pvStack_158;
  reference puStack_150;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *puStack_148;
  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
  _Stack_140;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *pvStack_138;
  WindowExpression *pWStack_130;
  SubqueryExpression *pSStack_128;
  reference ppStack_120;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
  _Stack_118;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
  _Stack_110;
  case_insensitive_map_t<unique_ptr<ParsedExpression>_> *pcStack_108;
  StarExpression *pSStack_100;
  reference puStack_f8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *puStack_f0;
  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
  _Stack_e8;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *pvStack_e0;
  OperatorExpression *pOStack_d8;
  LambdaExpression *pLStack_d0;
  reference pOStack_c8;
  OrderByNode *pOStack_c0;
  __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
  _Stack_b8;
  vector<duckdb::OrderByNode,_true> *pvStack_b0;
  reference puStack_a8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *puStack_a0;
  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
  _Stack_98;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *pvStack_90;
  FunctionExpression *pFStack_88;
  reference puStack_80;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *puStack_78;
  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
  _Stack_70;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *pvStack_68;
  ConjunctionExpression *pCStack_60;
  ComparisonExpression *pCStack_58;
  CollateExpression *pCStack_50;
  CastExpression *pCStack_48;
  reference pCStack_40;
  CaseCheck *pCStack_38;
  __normal_iterator<duckdb::CaseCheck_*,_std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>_>
  _Stack_30;
  vector<duckdb::CaseCheck,_true> *pvStack_28;
  CaseExpression *pCStack_20;
  BetweenExpression *pBStack_18;
  
  EVar1 = BaseExpression::GetExpressionClass(in_RDI);
  switch(EVar1) {
  case CASE:
    pCStack_20 = BaseExpression::Cast<duckdb::CaseExpression>(in_stack_fffffffffffffe40);
    pvStack_28 = &pCStack_20->case_checks;
    _Stack_30._M_current =
         (CaseCheck *)
         ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::begin
                   ((vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_> *)
                    in_stack_fffffffffffffdf8);
    pCStack_38 = (CaseCheck *)
                 ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::end
                           ((vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_> *)
                            in_stack_fffffffffffffdf8);
    while (bVar2 = __gnu_cxx::
                   operator!=<duckdb::CaseCheck_*,_std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>_>
                             ((__normal_iterator<duckdb::CaseCheck_*,_std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>_>
                               *)in_stack_fffffffffffffe00,
                              (__normal_iterator<duckdb::CaseCheck_*,_std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>_>
                               *)in_stack_fffffffffffffdf8), bVar2) {
      pCStack_40 = __gnu_cxx::
                   __normal_iterator<duckdb::CaseCheck_*,_std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>_>
                   ::operator*(&_Stack_30);
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
      __gnu_cxx::
      __normal_iterator<duckdb::CaseCheck_*,_std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>_>
      ::operator++(&_Stack_30);
    }
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
    ::operator()(in_stack_fffffffffffffe00,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffdf8);
    break;
  case CAST:
    pCStack_48 = BaseExpression::Cast<duckdb::CastExpression>(in_stack_fffffffffffffe40);
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
    ::operator()(in_stack_fffffffffffffe00,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffdf8);
    break;
  case COLUMN_REF:
  case CONSTANT:
  case DEFAULT:
  case PARAMETER:
  case POSITIONAL_REFERENCE:
  case LAMBDA_REF:
  case BOUND_EXPRESSION:
    break;
  case COMPARISON:
    pCStack_58 = BaseExpression::Cast<duckdb::ComparisonExpression>(in_stack_fffffffffffffe40);
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
    ::operator()(in_stack_fffffffffffffe00,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffdf8);
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
    ::operator()(in_stack_fffffffffffffe00,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffdf8);
    break;
  case CONJUNCTION:
    pCStack_60 = BaseExpression::Cast<duckdb::ConjunctionExpression>(in_stack_fffffffffffffe40);
    pvStack_68 = &pCStack_60->children;
    _Stack_70._M_current =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *)::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::begin((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     *)in_stack_fffffffffffffdf8);
    puStack_78 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)::std::
                    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ::end((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           *)in_stack_fffffffffffffdf8);
    while (bVar2 = __gnu_cxx::
                   operator!=<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffffe00,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffffdf8), bVar2) {
      puStack_80 = __gnu_cxx::
                   __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                   ::operator*(&_Stack_70);
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
      ::operator++(&_Stack_70);
    }
    break;
  case FUNCTION:
    pFStack_88 = BaseExpression::Cast<duckdb::FunctionExpression>(in_stack_fffffffffffffe40);
    pvStack_90 = &pFStack_88->children;
    _Stack_98._M_current =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *)::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::begin((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     *)in_stack_fffffffffffffdf8);
    puStack_a0 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)::std::
                    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ::end((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           *)in_stack_fffffffffffffdf8);
    while (bVar2 = __gnu_cxx::
                   operator!=<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffffe00,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffffdf8), bVar2) {
      puStack_a8 = __gnu_cxx::
                   __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                   ::operator*(&_Stack_98);
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
      ::operator++(&_Stack_98);
    }
    bVar2 = ::std::
            unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
            operator_bool((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           *)0x2a1ce09);
    if (bVar2) {
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
    }
    bVar2 = ::std::unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>::
            operator_bool((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                           *)0x2a1ce3f);
    if (bVar2) {
      pOVar3 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
               operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                           *)in_stack_fffffffffffffe00);
      pvStack_b0 = &pOVar3->orders;
      _Stack_b8._M_current =
           (OrderByNode *)
           ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::begin
                     ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                      in_stack_fffffffffffffdf8);
      pOStack_c0 = (OrderByNode *)
                   ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::end
                             ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                              in_stack_fffffffffffffdf8);
      while (bVar2 = __gnu_cxx::
                     operator!=<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                               ((__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                                 *)in_stack_fffffffffffffe00,
                                (__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                                 *)in_stack_fffffffffffffdf8), bVar2) {
        pOStack_c8 = __gnu_cxx::
                     __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                     ::operator*(&_Stack_b8);
        ::std::
        function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
        ::operator()(in_stack_fffffffffffffe00,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)in_stack_fffffffffffffdf8);
        __gnu_cxx::
        __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
        ::operator++(&_Stack_b8);
      }
    }
    break;
  case OPERATOR:
    pOStack_d8 = BaseExpression::Cast<duckdb::OperatorExpression>(in_stack_fffffffffffffe40);
    pvStack_e0 = &pOStack_d8->children;
    _Stack_e8._M_current =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *)::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::begin((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     *)in_stack_fffffffffffffdf8);
    puStack_f0 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)::std::
                    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ::end((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           *)in_stack_fffffffffffffdf8);
    while (bVar2 = __gnu_cxx::
                   operator!=<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffffe00,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffffdf8), bVar2) {
      puStack_f8 = __gnu_cxx::
                   __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                   ::operator*(&_Stack_e8);
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
      ::operator++(&_Stack_e8);
    }
    break;
  case STAR:
    pSStack_100 = BaseExpression::Cast<duckdb::StarExpression>(in_stack_fffffffffffffe40);
    bVar2 = ::std::
            unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
            operator_bool((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           *)0x2a1d012);
    if (bVar2) {
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
    }
    pcStack_108 = &pSStack_100->replace_list;
    _Stack_110._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                  *)in_stack_fffffffffffffdf8);
    _Stack_118._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                *)in_stack_fffffffffffffdf8);
    while (bVar2 = ::std::__detail::operator!=(&_Stack_110,&_Stack_118), bVar2) {
      ppStack_120 = ::std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_false,_true>
                    ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_false,_true>
                                 *)0x2a1d09c);
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
      ::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_false,_true>
                    *)in_stack_fffffffffffffe00);
    }
    break;
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(asStack_1d0,"Unimplemented expression class",&aStack_1d1);
    NotImplementedException::NotImplementedException(this,in_stack_fffffffffffffdf8);
    __cxa_throw(this,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  case SUBQUERY:
    pSStack_128 = BaseExpression::Cast<duckdb::SubqueryExpression>(in_stack_fffffffffffffe40);
    bVar2 = ::std::
            unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
            operator_bool((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           *)0x2a1d0f7);
    if (bVar2) {
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
    }
    break;
  case WINDOW:
    pWStack_130 = BaseExpression::Cast<duckdb::WindowExpression>(in_stack_fffffffffffffe40);
    pvStack_138 = &pWStack_130->partitions;
    _Stack_140._M_current =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *)::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::begin((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     *)in_stack_fffffffffffffdf8);
    puStack_148 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)::std::
                     vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ::end((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                            *)in_stack_fffffffffffffdf8);
    while (bVar2 = __gnu_cxx::
                   operator!=<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffffe00,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffffdf8), bVar2) {
      puStack_150 = __gnu_cxx::
                    __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                    ::operator*(&_Stack_140);
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
      ::operator++(&_Stack_140);
    }
    pvStack_158 = &pWStack_130->orders;
    _Stack_160._M_current =
         (OrderByNode *)
         ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::begin
                   ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                    in_stack_fffffffffffffdf8);
    pOStack_168 = (OrderByNode *)
                  ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::end
                            ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                             in_stack_fffffffffffffdf8);
    while (bVar2 = __gnu_cxx::
                   operator!=<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                             ((__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                               *)in_stack_fffffffffffffe00,
                              (__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                               *)in_stack_fffffffffffffdf8), bVar2) {
      pOStack_170 = __gnu_cxx::
                    __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                    ::operator*(&_Stack_160);
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
      __gnu_cxx::
      __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
      ::operator++(&_Stack_160);
    }
    pvStack_178 = &pWStack_130->children;
    _Stack_180._M_current =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *)::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::begin((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     *)in_stack_fffffffffffffdf8);
    puStack_188 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)::std::
                     vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ::end((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                            *)in_stack_fffffffffffffdf8);
    while (bVar2 = __gnu_cxx::
                   operator!=<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffffe00,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffffdf8), bVar2) {
      puStack_190 = __gnu_cxx::
                    __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                    ::operator*(&_Stack_180);
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
      ::operator++(&_Stack_180);
    }
    bVar2 = ::std::
            unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
            operator_bool((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           *)0x2a1d2fe);
    if (bVar2) {
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
    }
    bVar2 = ::std::
            unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
            operator_bool((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           *)0x2a1d334);
    if (bVar2) {
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
    }
    bVar2 = ::std::
            unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
            operator_bool((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           *)0x2a1d36a);
    if (bVar2) {
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
    }
    bVar2 = ::std::
            unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
            operator_bool((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           *)0x2a1d3a0);
    if (bVar2) {
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
    }
    bVar2 = ::std::
            unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
            operator_bool((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           *)0x2a1d3d6);
    if (bVar2) {
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
    }
    pvStack_198 = &pWStack_130->arg_orders;
    _Stack_1a0._M_current =
         (OrderByNode *)
         ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::begin
                   ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                    in_stack_fffffffffffffdf8);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::end
              ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
               in_stack_fffffffffffffdf8);
    while (bVar2 = __gnu_cxx::
                   operator!=<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                             ((__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                               *)in_stack_fffffffffffffe00,
                              (__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                               *)in_stack_fffffffffffffdf8), bVar2) {
      __gnu_cxx::
      __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
      ::operator*(&_Stack_1a0);
      ::std::
      function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
      ::operator()(in_stack_fffffffffffffe00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)in_stack_fffffffffffffdf8);
      __gnu_cxx::
      __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
      ::operator++(&_Stack_1a0);
    }
    break;
  case COLLATE:
    pCStack_50 = BaseExpression::Cast<duckdb::CollateExpression>(in_stack_fffffffffffffe40);
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
    ::operator()(in_stack_fffffffffffffe00,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffdf8);
    break;
  case LAMBDA:
    pLStack_d0 = BaseExpression::Cast<duckdb::LambdaExpression>(in_stack_fffffffffffffe40);
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
    ::operator()(in_stack_fffffffffffffe00,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffdf8);
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
    ::operator()(in_stack_fffffffffffffe00,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffdf8);
    break;
  case BETWEEN:
    pBStack_18 = BaseExpression::Cast<duckdb::BetweenExpression>(in_stack_fffffffffffffe40);
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
    ::operator()(in_stack_fffffffffffffe00,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffdf8);
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
    ::operator()(in_stack_fffffffffffffe00,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffdf8);
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
    ::operator()(in_stack_fffffffffffffe00,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffdf8);
  }
  return;
}

Assistant:

void ParsedExpressionIterator::EnumerateChildren(
    ParsedExpression &expr, const std::function<void(unique_ptr<ParsedExpression> &child)> &callback) {
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::BETWEEN: {
		auto &cast_expr = expr.Cast<BetweenExpression>();
		callback(cast_expr.input);
		callback(cast_expr.lower);
		callback(cast_expr.upper);
		break;
	}
	case ExpressionClass::CASE: {
		auto &case_expr = expr.Cast<CaseExpression>();
		for (auto &check : case_expr.case_checks) {
			callback(check.when_expr);
			callback(check.then_expr);
		}
		callback(case_expr.else_expr);
		break;
	}
	case ExpressionClass::CAST: {
		auto &cast_expr = expr.Cast<CastExpression>();
		callback(cast_expr.child);
		break;
	}
	case ExpressionClass::COLLATE: {
		auto &cast_expr = expr.Cast<CollateExpression>();
		callback(cast_expr.child);
		break;
	}
	case ExpressionClass::COMPARISON: {
		auto &comp_expr = expr.Cast<ComparisonExpression>();
		callback(comp_expr.left);
		callback(comp_expr.right);
		break;
	}
	case ExpressionClass::CONJUNCTION: {
		auto &conj_expr = expr.Cast<ConjunctionExpression>();
		for (auto &child : conj_expr.children) {
			callback(child);
		}
		break;
	}

	case ExpressionClass::FUNCTION: {
		auto &func_expr = expr.Cast<FunctionExpression>();
		for (auto &child : func_expr.children) {
			callback(child);
		}
		if (func_expr.filter) {
			callback(func_expr.filter);
		}
		if (func_expr.order_bys) {
			for (auto &order : func_expr.order_bys->orders) {
				callback(order.expression);
			}
		}
		break;
	}
	case ExpressionClass::LAMBDA: {
		auto &lambda_expr = expr.Cast<LambdaExpression>();
		callback(lambda_expr.lhs);
		callback(lambda_expr.expr);
		break;
	}
	case ExpressionClass::OPERATOR: {
		auto &op_expr = expr.Cast<OperatorExpression>();
		for (auto &child : op_expr.children) {
			callback(child);
		}
		break;
	}
	case ExpressionClass::STAR: {
		auto &star_expr = expr.Cast<StarExpression>();
		if (star_expr.expr) {
			callback(star_expr.expr);
		}
		for (auto &item : star_expr.replace_list) {
			callback(item.second);
		}
		break;
	}
	case ExpressionClass::SUBQUERY: {
		auto &subquery_expr = expr.Cast<SubqueryExpression>();
		if (subquery_expr.child) {
			callback(subquery_expr.child);
		}
		break;
	}
	case ExpressionClass::WINDOW: {
		auto &window_expr = expr.Cast<WindowExpression>();
		for (auto &partition : window_expr.partitions) {
			callback(partition);
		}
		for (auto &order : window_expr.orders) {
			callback(order.expression);
		}
		for (auto &child : window_expr.children) {
			callback(child);
		}
		if (window_expr.filter_expr) {
			callback(window_expr.filter_expr);
		}
		if (window_expr.start_expr) {
			callback(window_expr.start_expr);
		}
		if (window_expr.end_expr) {
			callback(window_expr.end_expr);
		}
		if (window_expr.offset_expr) {
			callback(window_expr.offset_expr);
		}
		if (window_expr.default_expr) {
			callback(window_expr.default_expr);
		}
		for (auto &order : window_expr.arg_orders) {
			callback(order.expression);
		}
		break;
	}
	case ExpressionClass::BOUND_EXPRESSION:
	case ExpressionClass::COLUMN_REF:
	case ExpressionClass::LAMBDA_REF:
	case ExpressionClass::CONSTANT:
	case ExpressionClass::DEFAULT:
	case ExpressionClass::PARAMETER:
	case ExpressionClass::POSITIONAL_REFERENCE:
		// these node types have no children
		break;
	default:
		// called on non ParsedExpression type!
		throw NotImplementedException("Unimplemented expression class");
	}
}